

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnitIndex.cpp
# Opt level: O3

Entry * __thiscall llvm::DWARFUnitIndex::getFromOffset(DWARFUnitIndex *this,uint32_t Offset)

{
  pointer ppEVar1;
  SectionContribution *pSVar2;
  Entry *pEVar3;
  uint32_t uVar4;
  Entry *in_RAX;
  long lVar5;
  pointer ppEVar6;
  ulong uVar7;
  ulong uVar8;
  __normal_iterator<llvm::DWARFUnitIndex::Entry_**,_std::vector<llvm::DWARFUnitIndex::Entry_*,_std::allocator<llvm::DWARFUnitIndex::Entry_*>_>_>
  __first;
  uint uVar9;
  __normal_iterator<llvm::DWARFUnitIndex::Entry_**,_std::vector<llvm::DWARFUnitIndex::Entry_*,_std::allocator<llvm::DWARFUnitIndex::Entry_*>_>_>
  __i;
  __normal_iterator<llvm::DWARFUnitIndex::Entry_**,_std::vector<llvm::DWARFUnitIndex::Entry_*,_std::allocator<llvm::DWARFUnitIndex::Entry_*>_>_>
  __last;
  __normal_iterator<llvm::DWARFUnitIndex::Entry_**,_std::vector<llvm::DWARFUnitIndex::Entry_*,_std::allocator<llvm::DWARFUnitIndex::Entry_*>_>_>
  __last_00;
  Entry *local_38;
  
  __first._M_current =
       (this->OffsetLookup).
       super__Vector_base<llvm::DWARFUnitIndex::Entry_*,_std::allocator<llvm::DWARFUnitIndex::Entry_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  __last_00._M_current =
       (this->OffsetLookup).
       super__Vector_base<llvm::DWARFUnitIndex::Entry_*,_std::allocator<llvm::DWARFUnitIndex::Entry_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__first._M_current == __last_00._M_current) {
    uVar4 = (this->Header).NumBuckets;
    local_38 = in_RAX;
    if (uVar4 != 0) {
      uVar7 = 0;
      do {
        pEVar3 = (this->Rows)._M_t.
                 super___uniq_ptr_impl<llvm::DWARFUnitIndex::Entry,_std::default_delete<llvm::DWARFUnitIndex::Entry[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_llvm::DWARFUnitIndex::Entry_*,_std::default_delete<llvm::DWARFUnitIndex::Entry[]>_>
                 .super__Head_base<0UL,_llvm::DWARFUnitIndex::Entry_*,_false>._M_head_impl;
        if ((_Head_base<0UL,_llvm::DWARFUnitIndex::Entry::SectionContribution_*,_false>)
            *(_Tuple_impl<0UL,_llvm::DWARFUnitIndex::Entry::SectionContribution_*,_std::default_delete<llvm::DWARFUnitIndex::Entry::SectionContribution[]>_>
              *)&pEVar3[uVar7].Contributions._M_t.
                 super___uniq_ptr_impl<llvm::DWARFUnitIndex::Entry::SectionContribution,_std::default_delete<llvm::DWARFUnitIndex::Entry::SectionContribution[]>_>
            != (SectionContribution *)0x0) {
          local_38 = pEVar3 + uVar7;
          std::vector<llvm::DWARFUnitIndex::Entry*,std::allocator<llvm::DWARFUnitIndex::Entry*>>::
          emplace_back<llvm::DWARFUnitIndex::Entry*>
                    ((vector<llvm::DWARFUnitIndex::Entry*,std::allocator<llvm::DWARFUnitIndex::Entry*>>
                      *)&this->OffsetLookup,&local_38);
          uVar4 = (this->Header).NumBuckets;
        }
        uVar9 = (int)uVar7 + 1;
        uVar7 = (ulong)uVar9;
      } while (uVar9 != uVar4);
      __first._M_current =
           (this->OffsetLookup).
           super__Vector_base<llvm::DWARFUnitIndex::Entry_*,_std::allocator<llvm::DWARFUnitIndex::Entry_*>_>
           ._M_impl.super__Vector_impl_data._M_start;
      __last_00._M_current =
           (this->OffsetLookup).
           super__Vector_base<llvm::DWARFUnitIndex::Entry_*,_std::allocator<llvm::DWARFUnitIndex::Entry_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    }
    if (__first._M_current != __last_00._M_current) {
      uVar7 = (long)__last_00._M_current - (long)__first._M_current >> 3;
      lVar5 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<llvm::DWARFUnitIndex::Entry**,std::vector<llvm::DWARFUnitIndex::Entry*,std::allocator<llvm::DWARFUnitIndex::Entry*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<llvm::DWARFUnitIndex::getFromOffset(unsigned_int)const::__0>>
                (__first,__last_00,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_dcodeIO[P]binaryen_third_party_llvm_project_DWARFUnitIndex_cpp:170:30)>
                  )this);
      if ((long)__last_00._M_current - (long)__first._M_current < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<llvm::DWARFUnitIndex::Entry**,std::vector<llvm::DWARFUnitIndex::Entry*,std::allocator<llvm::DWARFUnitIndex::Entry*>>>,__gnu_cxx::__ops::_Iter_comp_iter<llvm::DWARFUnitIndex::getFromOffset(unsigned_int)const::__0>>
                  (__first,__last_00,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_dcodeIO[P]binaryen_third_party_llvm_project_DWARFUnitIndex_cpp:170:30)>
                    )this);
      }
      else {
        __last._M_current = __first._M_current + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<llvm::DWARFUnitIndex::Entry**,std::vector<llvm::DWARFUnitIndex::Entry*,std::allocator<llvm::DWARFUnitIndex::Entry*>>>,__gnu_cxx::__ops::_Iter_comp_iter<llvm::DWARFUnitIndex::getFromOffset(unsigned_int)const::__0>>
                  (__first,__last,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_dcodeIO[P]binaryen_third_party_llvm_project_DWARFUnitIndex_cpp:170:30)>
                    )this);
        for (; __last._M_current != __last_00._M_current; __last._M_current = __last._M_current + 1)
        {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<llvm::DWARFUnitIndex::Entry**,std::vector<llvm::DWARFUnitIndex::Entry*,std::allocator<llvm::DWARFUnitIndex::Entry*>>>,__gnu_cxx::__ops::_Val_comp_iter<llvm::DWARFUnitIndex::getFromOffset(unsigned_int)const::__0>>
                    (__last,(_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_dcodeIO[P]binaryen_third_party_llvm_project_DWARFUnitIndex_cpp:170:30)>
                             )this);
        }
      }
    }
  }
  ppEVar1 = (this->OffsetLookup).
            super__Vector_base<llvm::DWARFUnitIndex::Entry_*,_std::allocator<llvm::DWARFUnitIndex::Entry_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar7 = (long)(this->OffsetLookup).
                super__Vector_base<llvm::DWARFUnitIndex::Entry_*,_std::allocator<llvm::DWARFUnitIndex::Entry_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3;
  if (0 < (long)uVar7) {
    lVar5 = (long)this->InfoColumn;
    ppEVar6 = ppEVar1;
    do {
      uVar8 = uVar7 >> 1;
      if (*(uint *)((long)(ppEVar6[uVar8]->Contributions)._M_t.
                          super___uniq_ptr_impl<llvm::DWARFUnitIndex::Entry::SectionContribution,_std::default_delete<llvm::DWARFUnitIndex::Entry::SectionContribution[]>_>
                          ._M_t + lVar5 * 8) <= Offset) {
        ppEVar6 = ppEVar6 + uVar8 + 1;
        uVar8 = ~uVar8 + uVar7;
      }
      uVar7 = uVar8;
    } while (0 < (long)uVar8);
    if (ppEVar6 != ppEVar1) {
      pSVar2 = (ppEVar6[-1]->Contributions)._M_t.
               super___uniq_ptr_impl<llvm::DWARFUnitIndex::Entry::SectionContribution,_std::default_delete<llvm::DWARFUnitIndex::Entry::SectionContribution[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_llvm::DWARFUnitIndex::Entry::SectionContribution_*,_std::default_delete<llvm::DWARFUnitIndex::Entry::SectionContribution[]>_>
               .super__Head_base<0UL,_llvm::DWARFUnitIndex::Entry::SectionContribution_*,_false>.
               _M_head_impl;
      if (pSVar2[lVar5].Length + pSVar2[lVar5].Offset <= Offset) {
        return (Entry *)0x0;
      }
      return ppEVar6[-1];
    }
  }
  return (Entry *)0x0;
}

Assistant:

const DWARFUnitIndex::Entry *
DWARFUnitIndex::getFromOffset(uint32_t Offset) const {
  if (OffsetLookup.empty()) {
    for (uint32_t i = 0; i != Header.NumBuckets; ++i)
      if (Rows[i].Contributions)
        OffsetLookup.push_back(&Rows[i]);
    llvm::sort(OffsetLookup, [&](Entry *E1, Entry *E2) {
      return E1->Contributions[InfoColumn].Offset <
             E2->Contributions[InfoColumn].Offset;
    });
  }
  auto I = partition_point(OffsetLookup, [&](Entry *E2) {
    return E2->Contributions[InfoColumn].Offset <= Offset;
  });
  if (I == OffsetLookup.begin())
    return nullptr;
  --I;
  const auto *E = *I;
  const auto &InfoContrib = E->Contributions[InfoColumn];
  if ((InfoContrib.Offset + InfoContrib.Length) <= Offset)
    return nullptr;
  return E;
}